

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::EntityType::ReadFromTokenisedString
          (EntityType *this,KString *String,KString *Seperator)

{
  pointer pcVar1;
  unsigned_short uVar2;
  int iVar3;
  char *__nptr;
  KException *this_00;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vValues;
  KString sCopy;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_88;
  KString local_70;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar1 = (String->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + String->_M_string_length);
  local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
  local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_short *)0x0;
  __nptr = strtok((char *)local_50[0],(Seperator->_M_dataplus)._M_p);
  if (__nptr != (char *)0x0) {
    do {
      iVar3 = atoi(__nptr);
      uVar2 = (unsigned_short)iVar3;
      if (iVar3 < 1) {
        uVar2 = 0;
      }
      local_70._M_dataplus._M_p._0_2_ = uVar2;
      if (local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_short *)&local_70);
      }
      else {
        *local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar2;
        local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      __nptr = strtok((char *)0x0,(Seperator->_M_dataplus)._M_p);
    } while (__nptr != (char *)0x0);
  }
  if ((long)local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start == 0xe) {
    this->m_ui8EntityKind =
         (KUINT8)*local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    this->m_ui8Domain =
         (KUINT8)local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start[1];
    this->m_ui16Country =
         local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_start[2];
    this->m_ui8Category =
         (KUINT8)local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start[3];
    this->m_ui8SubCategory =
         (KUINT8)local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start[4];
    this->m_ui8Specific =
         (KUINT8)local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start[5];
    this->m_ui8Extra =
         (KUINT8)local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start[6];
    operator_delete(local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ReadFromTokenisedString","");
  KException::KException<char_const*>
            (this_00,&local_70,8,"Token String Must Contain 7 Integer Values Only.");
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void EntityType::ReadFromTokenisedString(const KString &String, const KString &Seperator /*= ","*/ ) noexcept(false)
{
    // Copy the string, we don't want to change the string we have been passed.
    KString sCopy = String;

    vector<KUINT16> vValues;

    KCHAR8 * token = strtok( ( KCHAR8 * )sCopy.c_str(), Seperator.c_str() );

    while (token != nullptr)
    {
        auto i = atoi(token);
        if( i < 0 ) i = 0; // If the value is less than 0 then we need to make it 0.

        vValues.push_back(static_cast<unsigned short>(i));

        // Get next token:
        token = strtok(nullptr, Seperator.c_str());
    }

    // We need 7 values in total, if not we have a problem.
    if( vValues.size() != 7 )
    {
        throw KException( __FUNCTION__, INVALID_DATA, "Token String Must Contain 7 Integer Values Only." );
    }

    // Set the new type.
    m_ui8EntityKind = vValues[0];
    m_ui8Domain = vValues[1];
    m_ui16Country = vValues[2];
    m_ui8Category = vValues[3];
    m_ui8SubCategory = vValues[4];
    m_ui8Specific = vValues[5];
    m_ui8Extra = vValues[6];
}